

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::TensorValue::set_allocated_doubles
          (TensorValue *this,TensorValue_RepeatedDoubles *doubles)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_value(this);
  if (doubles != (TensorValue_RepeatedDoubles *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(doubles->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      doubles = (TensorValue_RepeatedDoubles *)
                google::protobuf::internal::GetOwnedMessageInternal
                          (message_arena,&doubles->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 6;
    (this->value_).doubles_ = doubles;
  }
  return;
}

Assistant:

void TensorValue::set_allocated_doubles(::CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles* doubles) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (doubles) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>::GetOwningArena(doubles);
    if (message_arena != submessage_arena) {
      doubles = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, doubles, submessage_arena);
    }
    set_has_doubles();
    value_.doubles_ = doubles;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.TensorValue.doubles)
}